

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::AsyncIoStreamWithGuards::tryRead
          (AsyncIoStreamWithGuards *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  AsyncIoStreamWithGuards *node;
  AsyncIoStreamWithGuards *local_58;
  PromiseArena *local_50;
  _func_int **local_48;
  EventLoop *local_40;
  
  if (*(char *)((long)buffer + 0x48) == '\x01') {
    (**(code **)(**(long **)((long)buffer + 0x20) + 8))
              (this,*(long **)((long)buffer + 0x20),minBytes,maxBytes);
  }
  else {
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)&stack0xffffffffffffffa8);
    local_50 = (PromiseArena *)buffer;
    local_48 = (_func_int **)minBytes;
    local_40 = (EventLoop *)maxBytes;
    Promise<void>::
    then<kj::AsyncIoStreamWithGuards::tryRead(void*,unsigned_long,unsigned_long)::_lambda()_1_>
              ((Promise<void> *)this,(anon_class_32_4_a4bd11c1_for_func *)&stack0xffffffffffffffa8);
    node = local_58;
    if (local_58 != (AsyncIoStreamWithGuards *)0x0) {
      local_58 = (AsyncIoStreamWithGuards *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
    }
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    if (readGuardReleased) {
      return inner->tryRead(buffer, minBytes, maxBytes);
    }
    return readGuard.addBranch().then([this, buffer, minBytes, maxBytes] {
      return inner->tryRead(buffer, minBytes, maxBytes);
    });
  }